

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Count.cpp
# Opt level: O2

void __thiscall Count::~Count(Count *this)

{
  (this->super_Application)._vptr_Application = (_func_int **)&PTR__Count_0021ec30;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&this->_pathToFiles);
  Application::~Application(&this->super_Application);
  return;
}

Assistant:

Count::~Count()
{
}